

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::run(void)

{
  test_array8_int32();
  fail_array8_int32_missing_one();
  fail_array8_int32_missing_two();
  fail_array8_int32_missing_three();
  fail_array8_int32_missing_four();
  fail_array8_int32_missing_five();
  fail_array8_int32_missing_six();
  fail_array8_int32_missing_seven();
  fail_array8_int32_missing_eight();
  fail_array8_int32_missing_length();
  fail_array8_int32_invalid_length();
  fail_array8_int32_overflow();
  test_array16_int32();
  fail_array16_int32_missing_one();
  fail_array16_int32_missing_two();
  fail_array16_int32_missing_three();
  fail_array16_int32_missing_four();
  fail_array16_int32_missing_five();
  fail_array16_int32_missing_six();
  fail_array16_int32_missing_seven();
  fail_array16_int32_missing_eight();
  fail_array16_int32_missing_length_one();
  fail_array16_int32_missing_length_two();
  fail_array16_int32_invalid_length();
  test_array32_int32();
  fail_array32_int32_missing_one();
  fail_array32_int32_missing_two();
  fail_array32_int32_missing_three();
  fail_array32_int32_missing_four();
  fail_array32_int32_missing_five();
  fail_array32_int32_missing_six();
  fail_array32_int32_missing_seven();
  fail_array32_int32_missing_eight();
  fail_array32_int32_missing_length_one();
  fail_array32_int32_missing_length_two();
  fail_array32_int32_missing_length_three();
  fail_array32_int32_missing_length_four();
  fail_array32_int32_invalid_length();
  test_array64_int32();
  fail_array64_int32_missing_one();
  fail_array64_int32_missing_two();
  fail_array64_int32_missing_three();
  fail_array64_int32_missing_four();
  fail_array64_int32_missing_five();
  fail_array64_int32_missing_six();
  fail_array64_int32_missing_seven();
  fail_array64_int32_missing_eight();
  fail_array64_int32_missing_length_one();
  fail_array64_int32_missing_length_two();
  fail_array64_int32_missing_length_three();
  fail_array64_int32_missing_length_four();
  fail_array64_int32_missing_length_five();
  fail_array64_int32_missing_length_six();
  fail_array64_int32_missing_length_seven();
  fail_array64_int32_missing_length_eight();
  fail_array64_int32_invalid_length();
  return;
}

Assistant:

void run()
{
    test_array8_int32();
    fail_array8_int32_missing_one();
    fail_array8_int32_missing_two();
    fail_array8_int32_missing_three();
    fail_array8_int32_missing_four();
    fail_array8_int32_missing_five();
    fail_array8_int32_missing_six();
    fail_array8_int32_missing_seven();
    fail_array8_int32_missing_eight();
    fail_array8_int32_missing_length();
    fail_array8_int32_invalid_length();
    fail_array8_int32_overflow();

    test_array16_int32();
    fail_array16_int32_missing_one();
    fail_array16_int32_missing_two();
    fail_array16_int32_missing_three();
    fail_array16_int32_missing_four();
    fail_array16_int32_missing_five();
    fail_array16_int32_missing_six();
    fail_array16_int32_missing_seven();
    fail_array16_int32_missing_eight();
    fail_array16_int32_missing_length_one();
    fail_array16_int32_missing_length_two();
    fail_array16_int32_invalid_length();

    test_array32_int32();
    fail_array32_int32_missing_one();
    fail_array32_int32_missing_two();
    fail_array32_int32_missing_three();
    fail_array32_int32_missing_four();
    fail_array32_int32_missing_five();
    fail_array32_int32_missing_six();
    fail_array32_int32_missing_seven();
    fail_array32_int32_missing_eight();
    fail_array32_int32_missing_length_one();
    fail_array32_int32_missing_length_two();
    fail_array32_int32_missing_length_three();
    fail_array32_int32_missing_length_four();
    fail_array32_int32_invalid_length();

    test_array64_int32();
    fail_array64_int32_missing_one();
    fail_array64_int32_missing_two();
    fail_array64_int32_missing_three();
    fail_array64_int32_missing_four();
    fail_array64_int32_missing_five();
    fail_array64_int32_missing_six();
    fail_array64_int32_missing_seven();
    fail_array64_int32_missing_eight();
    fail_array64_int32_missing_length_one();
    fail_array64_int32_missing_length_two();
    fail_array64_int32_missing_length_three();
    fail_array64_int32_missing_length_four();
    fail_array64_int32_missing_length_five();
    fail_array64_int32_missing_length_six();
    fail_array64_int32_missing_length_seven();
    fail_array64_int32_missing_length_eight();
    fail_array64_int32_invalid_length();
}